

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ensemble.cpp
# Opt level: O3

void __thiscall NPT::ener(NPT *this)

{
  _func_int *p_Var1;
  vector<double,_std::allocator<double>_> *in_RSI;
  
  p_Var1 = (_func_int *)((long)&this->_vptr_NPT + (long)this->_vptr_NPT[-5]);
  Hamiltonian::ener((Hamiltonian *)(p_Var1 + *(long *)(*(long *)p_Var1 + -0x20) + 8),in_RSI);
  return;
}

Assistant:

valtype NPT::ener(const vector<valtype>& vals) const {
  // Note that we don't do bound-check here
  // Also, we don't slice the input vector
  // by just assuming the hamiltonian functor
  // will use and only use as many as it needs
  // so that the last element is the volumn term
  return (H.ener(vals) + P*vals.back())/(kB*T);
}